

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

int32_t pkg_installLibrary(char *installDir,char *targetDir,UBool noVersion)

{
  char local_228 [8];
  char cmd [512];
  int32_t result;
  UBool noVersion_local;
  char *targetDir_local;
  char *installDir_local;
  
  cmd[0x1f8] = '\0';
  cmd[0x1f9] = '\0';
  cmd[0x1fa] = '\0';
  cmd[0x1fb] = '\0';
  cmd[0x1ff] = noVersion;
  sprintf(local_228,"cd %s && %s %s %s%s%s",targetDir,pkgDataFlags[0x10],0x5120a0,installDir,"/",
          0x5120a0);
  cmd._504_4_ = runCommand(local_228,'\0');
  if (cmd._504_4_ == 0) {
    installDir_local._4_4_ = cmd._504_4_;
    if (cmd[0x1ff] == '\0') {
      installDir_local._4_4_ = pkg_createSymLinks(installDir,'\x01');
    }
  }
  else {
    fprintf(_stderr,"Error installing library. Failed command: %s\n",local_228);
    installDir_local._4_1_ = cmd[0x1f8];
    installDir_local._5_1_ = cmd[0x1f9];
    installDir_local._6_1_ = cmd[0x1fa];
    installDir_local._7_1_ = cmd[0x1fb];
  }
  return installDir_local._4_4_;
}

Assistant:

static int32_t pkg_installLibrary(const char *installDir, const char *targetDir, UBool noVersion) {
    int32_t result = 0;
    char cmd[SMALL_BUFFER_MAX_SIZE];

    sprintf(cmd, "cd %s && %s %s %s%s%s",
            targetDir,
            pkgDataFlags[INSTALL_CMD],
            libFileNames[LIB_FILE_VERSION],
            installDir, PKGDATA_FILE_SEP_STRING, libFileNames[LIB_FILE_VERSION]
            );

    result = runCommand(cmd);

    if (result != 0) {
        fprintf(stderr, "Error installing library. Failed command: %s\n", cmd);
        return result;
    }

#ifdef CYGWINMSVC
    sprintf(cmd, "cd %s && %s %s.lib %s",
            targetDir,
            pkgDataFlags[INSTALL_CMD],
            libFileNames[LIB_FILE],
            installDir
            );
    result = runCommand(cmd);

    if (result != 0) {
        fprintf(stderr, "Error installing library. Failed command: %s\n", cmd);
        return result;
    }
#elif U_PLATFORM == U_PF_CYGWIN
    sprintf(cmd, "cd %s && %s %s %s",
            targetDir,
            pkgDataFlags[INSTALL_CMD],
            libFileNames[LIB_FILE_CYGWIN_VERSION],
            installDir
            );
    result = runCommand(cmd);

    if (result != 0) {
        fprintf(stderr, "Error installing library. Failed command: %s\n", cmd);
        return result;
    }

#elif U_PLATFORM == U_PF_OS390
    if (T_FileStream_file_exists(libFileNames[LIB_FILE_OS390BATCH_VERSION])) {
        sprintf(cmd, "%s %s %s",
                pkgDataFlags[INSTALL_CMD],
                libFileNames[LIB_FILE_OS390BATCH_VERSION],
                installDir
                );
        result = runCommand(cmd);

        if (result != 0) {
            fprintf(stderr, "Error installing library. Failed command: %s\n", cmd);
            return result;
        }
    }
#endif

    if (noVersion) {
        return result;
    } else {
        return pkg_createSymLinks(installDir, TRUE);
    }
}